

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_529b62::QPDFWordTokenFinder::~QPDFWordTokenFinder(QPDFWordTokenFinder *this)

{
  (this->super_Finder)._vptr_Finder = (_func_int **)&PTR__QPDFWordTokenFinder_002b0150;
  std::__cxx11::string::~string((string *)&this->str);
  return;
}

Assistant:

~QPDFWordTokenFinder() override = default;